

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O3

void __thiscall sf::Shape::~Shape(Shape *this)

{
  pointer pVVar1;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Shape_0016b4e0;
  (this->super_Transformable)._vptr_Transformable = (_func_int **)&PTR__Shape_0016b518;
  VertexBuffer::~VertexBuffer(&this->m_outlineVerticesBuffer);
  VertexBuffer::~VertexBuffer(&this->m_verticesBuffer);
  (this->m_outlineVertices).super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_0016b708
  ;
  pVVar1 = (this->m_outlineVertices).m_vertices.
           super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_outlineVertices).m_vertices.
                                 super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  (this->m_vertices).super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_0016b708;
  pVVar1 = (this->m_vertices).m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_vertices).m_vertices.
                                 super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  Transformable::~Transformable(&this->super_Transformable);
  return;
}

Assistant:

Shape::~Shape()
{
}